

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
::delete_buckets(table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
                 *this)

{
  bucket_pointer ppVar1;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
  *n_00;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
  *in_RDI;
  node_pointer next;
  node_pointer n;
  size_t in_stack_ffffffffffffffd8;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
  *this_00;
  
  if (in_RDI->buckets_ != (bucket_pointer)0x0) {
    ppVar1 = get_bucket(in_RDI,in_stack_ffffffffffffffd8);
    this_00 = (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
               *)ppVar1->next_;
    while (this_00 !=
           (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
            *)0x0) {
      n_00 = (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
              *)next_node((link_pointer)this_00);
      destroy_node(this_00,(node_pointer)n_00);
      this_00 = n_00;
    }
    destroy_buckets((table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
                     *)0x0);
    in_RDI->buckets_ = (bucket_pointer)0x0;
    in_RDI->max_load_ = 0;
    in_RDI->size_ = 0;
  }
  return;
}

Assistant:

void delete_buckets()
        {
          if (buckets_) {
            node_pointer n =
              static_cast<node_pointer>(get_bucket(bucket_count_)->next_);

            if (bucket::extra_node) {
              node_pointer next = next_node(n);
              boost::unordered::detail::func::destroy(pointer<node>::get(n));
              node_allocator_traits::deallocate(node_alloc(), n, 1);
              n = next;
            }

            while (n) {
              node_pointer next = next_node(n);
              destroy_node(n);
              n = next;
            }

            destroy_buckets();
            buckets_ = bucket_pointer();
            max_load_ = 0;
            size_ = 0;
          }
        }